

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O2

void __thiscall Blip_Buffer::clear(Blip_Buffer *this,int entire_buffer)

{
  this->offset_ = 0;
  this->reader_accum_ = 0;
  this->modified_ = 0;
  if (this->buffer_ != (buf_t_ *)0x0) {
    if (entire_buffer != 0) {
      entire_buffer = this->buffer_size_;
    }
    memset(this->buffer_,0,(long)entire_buffer * 4 + 0x48);
    return;
  }
  return;
}

Assistant:

void Blip_Buffer::clear( int entire_buffer )
{
	offset_      = 0;
	reader_accum_ = 0;
	modified_    = 0;
	if ( buffer_ )
	{
		long count = (entire_buffer ? buffer_size_ : samples_avail());
		memset( buffer_, 0, (count + blip_buffer_extra_) * sizeof (buf_t_) );
	}
}